

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void lua_settable(lua_State *L,int idx)

{
  int iVar1;
  undefined4 uVar2;
  TValue *t;
  TValue *slot;
  StkId pTVar3;
  
  t = index2addr(L,idx);
  if (t->tt_ == 0x45) {
    slot = luaH_get((Table *)(t->value_).gc,L->top + -2);
    if (slot->tt_ != 0) {
      pTVar3 = L->top;
      if ((((pTVar3[-1].tt_ & 0x40) != 0) && ((((Table *)(t->value_).gc)->marked & 4) != 0)) &&
         (((pTVar3[-1].value_.gc)->marked & 3) != 0)) {
        luaC_barrierback_(L,(Table *)(t->value_).gc);
        pTVar3 = L->top;
      }
      iVar1 = pTVar3[-1].tt_;
      uVar2 = *(undefined4 *)&pTVar3[-1].field_0xc;
      slot->value_ = pTVar3[-1].value_;
      slot->tt_ = iVar1;
      *(undefined4 *)&slot->field_0xc = uVar2;
      goto LAB_0010f8a4;
    }
  }
  else {
    slot = (TValue *)0x0;
  }
  luaV_finishset(L,t,L->top + -2,L->top + -1,slot);
LAB_0010f8a4:
  L->top = L->top + -2;
  return;
}

Assistant:

LUA_API void lua_settable (lua_State *L, int idx) {
  StkId t;
  lua_lock(L);
  api_checknelems(L, 2);
  t = index2addr(L, idx);
  luaV_settable(L, t, L->top - 2, L->top - 1);
  L->top -= 2;  /* pop index and value */
  lua_unlock(L);
}